

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<bool>::Walker(Walker<bool> *this)

{
  stack<re2::WalkState<bool>,std::deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>>>
  *this_00;
  Walker<bool> *this_local;
  
  this->_vptr_Walker = (_func_int **)&PTR__Walker_001c64a0;
  this_00 = (stack<re2::WalkState<bool>,std::deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>>>
             *)operator_new(0x50);
  std::
  stack<re2::WalkState<bool>,std::deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>>>
  ::stack<std::deque<re2::WalkState<bool>,std::allocator<re2::WalkState<bool>>>,void>(this_00);
  this->stack_ = (stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
                  *)this_00;
  this->stopped_early_ = false;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new stack<WalkState<T> >;
  stopped_early_ = false;
}